

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Matrix * __thiscall rw::Matrix::rotate(Matrix *this,V3d *axis,float32 angle,CombineOp op)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float32 fVar5;
  float32 fVar6;
  float32 fVar7;
  float32 fVar8;
  float32 fVar9;
  float32 fVar10;
  float32 fVar11;
  Matrix *src2;
  Matrix *src1;
  Matrix *pMVar12;
  Matrix rot;
  Matrix tmp;
  Matrix MStack_98;
  Matrix local_58;
  
  pMVar12 = &MStack_98;
  makeRotation(&MStack_98,axis,angle);
  if (op != COMBINEREPLACE) {
    src2 = &MStack_98;
    src1 = this;
    if ((op != COMBINEPOSTCONCAT) && (src2 = this, src1 = &MStack_98, op != COMBINEPRECONCAT)) {
      return this;
    }
    pMVar12 = &local_58;
    mult(&local_58,src1,src2);
  }
  fVar10 = (pMVar12->right).x;
  fVar11 = (pMVar12->right).y;
  uVar1 = *(undefined8 *)&(pMVar12->right).z;
  fVar8 = (pMVar12->up).x;
  fVar9 = (pMVar12->up).y;
  uVar2 = *(undefined8 *)&(pMVar12->up).z;
  fVar6 = (pMVar12->at).x;
  fVar7 = (pMVar12->at).y;
  uVar3 = *(undefined8 *)&(pMVar12->at).z;
  fVar5 = (pMVar12->pos).y;
  uVar4 = *(undefined8 *)&(pMVar12->pos).z;
  (this->pos).x = (pMVar12->pos).x;
  (this->pos).y = fVar5;
  *(undefined8 *)&(this->pos).z = uVar4;
  (this->at).x = fVar6;
  (this->at).y = fVar7;
  *(undefined8 *)&(this->at).z = uVar3;
  (this->up).x = fVar8;
  (this->up).y = fVar9;
  *(undefined8 *)&(this->up).z = uVar2;
  (this->right).x = fVar10;
  (this->right).y = fVar11;
  *(undefined8 *)&(this->right).z = uVar1;
  return this;
}

Assistant:

Matrix*
Matrix::rotate(const V3d *axis, float32 angle, CombineOp op)
{
	Matrix tmp, rot;
	makeRotation(&rot, axis, angle);
	switch(op){
	case COMBINEREPLACE:
		*this = rot;
		break;
	case COMBINEPRECONCAT:
		mult(&tmp, &rot, this);
		*this = tmp;
		break;
	case COMBINEPOSTCONCAT:
		mult(&tmp, this, &rot);
		*this = tmp;
		break;
	}
	return this;
}